

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

void __thiscall L11_2::Vector::reset(Vector *this,double arg1,double arg2,MODE mode)

{
  double dVar1;
  double dVar2;
  MODE mode_local;
  double arg2_local;
  double arg1_local;
  Vector *this_local;
  
  if (mode == RECT) {
    this->_x = arg1;
    this->_y = arg2;
    dVar1 = sqrt(this->_x * this->_x + this->_y * this->_y);
    this->_radius = dVar1;
    dVar1 = atan2(this->_y,this->_x);
    this->_radian = dVar1;
  }
  else {
    this->_radius = arg1;
    this->_radian = arg2;
    dVar1 = this->_radius;
    dVar2 = cos(this->_radian);
    this->_x = dVar1 * dVar2;
    dVar1 = this->_radius;
    dVar2 = sin(this->_radian);
    this->_y = dVar1 * dVar2;
  }
  return;
}

Assistant:

void Vector::reset(double arg1, double arg2, MODE mode) {
        if (mode == MODE::RECT) {
            _x = arg1;
            _y = arg2;
            _radius = std::sqrt(_x * _x + _y * _y);
            _radian = std::atan2(_y, _x);
        } else {
            _radius = arg1;
            _radian = arg2;
            _x = _radius * std::cos(_radian);
            _y = _radius * std::sin(_radian);
        }
    }